

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_fffffffffffffef8;
  stbi__context *in_stack_ffffffffffffff00;
  stbi__context *in_stack_ffffffffffffff08;
  
  stbi__start_callbacks(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(void *)0x109a77);
  iVar1 = stbi__info_main(in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
                          (int *)in_stack_fffffffffffffef8,(int *)0x109a97);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__info_main(&s,x,y,comp);
}